

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut(ConfidentialTxOut *this,ConfidentialTxOut *param_1)

{
  bool bVar1;
  undefined7 uVar2;
  
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_007ed4d8;
  bVar1 = (param_1->super_AbstractTxOut).value_.ignore_check_;
  uVar2 = *(undefined7 *)&(param_1->super_AbstractTxOut).value_.field_0x9;
  (this->super_AbstractTxOut).value_.amount_ = (param_1->super_AbstractTxOut).value_.amount_;
  (this->super_AbstractTxOut).value_.ignore_check_ = bVar1;
  *(undefined7 *)&(this->super_AbstractTxOut).value_.field_0x9 = uVar2;
  Script::Script(&(this->super_AbstractTxOut).locking_script_,
                 &(param_1->super_AbstractTxOut).locking_script_);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_007ed918;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,&param_1->asset_);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,&param_1->confidential_value_);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,&param_1->nonce_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->surjection_proof_).data_,&(param_1->surjection_proof_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->range_proof_).data_,&(param_1->range_proof_).data_);
  return;
}

Assistant:

class CFD_CORE_EXPORT ConfidentialTxOut : public AbstractTxOut {
 public:
  /**
   * @brief constructor
   */
  ConfidentialTxOut();
  /**
   * @brief constructor.
   * @param[in] locking_script      locking script.
   * @param[in] asset               asset.
   * @param[in] confidential_value  value by confidential transaction.
   */
  ConfidentialTxOut(
      const Script& locking_script, const ConfidentialAssetId& asset,
      const ConfidentialValue& confidential_value);
  /**
   * @brief constructor.
   *
   * For information registration after blind.
   * @param[in] locking_script      locking script.
   * @param[in] asset               asset.
   * @param[in] confidential_value  value by confidential transaction.
   * @param[in] nonce               nonce.
   * @param[in] surjection_proof    surjection proof.
   * @param[in] range_proof         range proof.
   */
  ConfidentialTxOut(
      const Script& locking_script, const ConfidentialAssetId& asset,
      const ConfidentialValue& confidential_value,
      const ConfidentialNonce& nonce, const ByteData& surjection_proof,
      const ByteData& range_proof);
  /**
   * @brief constructor.
   *
   * For additional fee.
   * @param[in] asset               asset.
   * @param[in] confidential_value  value by confidential transaction.
   */
  ConfidentialTxOut(
      const ConfidentialAssetId& asset,
      const ConfidentialValue& confidential_value);
  /**
   * @brief constructor.
   *
   * For additional fee.
   * @param[in] asset               asset.
   * @param[in] amount              amount.
   */
  ConfidentialTxOut(const ConfidentialAssetId& asset, const Amount& amount);
  /**
   * @brief constructor.
   * @param[in] address             address.
   * @param[in] asset               asset.
   * @param[in] amount              amount.
   */
  ConfidentialTxOut(
      const Address& address, const ConfidentialAssetId& asset,
      const Amount& amount);
  /**
   * @brief constructor.
   * @param[in] confidential_address  confidential address.
   * @param[in] asset                 asset.
   * @param[in] amount                amount.
   */
  ConfidentialTxOut(
      const ElementsConfidentialAddress& confidential_address,
      const ConfidentialAssetId& asset, const Amount& amount);
  /**
   * @brief destructor
   */
  virtual ~ConfidentialTxOut() {
    // do nothing
  }

  /**
   * @brief set commitment.
   *
   * for register api after blind/unblind.
   * @param[in] asset               asset.
   * @param[in] confidential_value  value commitment by confidential transaction.
   * @param[in] nonce               nonce.
   * @param[in] surjection_proof    surjection proof.
   * @param[in] range_proof         range proof.
   */
  void SetCommitment(
      const ConfidentialAssetId& asset,
      const ConfidentialValue& confidential_value,
      const ConfidentialNonce& nonce, const ByteData& surjection_proof,
      const ByteData& range_proof);

  /**
   * @brief set nonce.
   * @param[in] nonce   nonce.
   */
  void SetNonce(const ConfidentialNonce& nonce);
  /**
   * @brief set amount value.
   * @param[in] value     amount value.
   */
  virtual void SetValue(const Amount& value);
  /**
   * @brief set asset.
   * @return asset
   */
  ConfidentialAssetId GetAsset() const { return asset_; }

  /**
   * @brief Get confidential value.
   * @return confidential value
   */
  ConfidentialValue GetConfidentialValue() const {
    return confidential_value_;
  }

  /**
   * @brief Get nonce
   * @return nonce
   */
  ConfidentialNonce GetNonce() const { return nonce_; }

  /**
   * @brief Get surjection proof
   * @return surjection proof
   */
  ByteData GetSurjectionProof() const { return surjection_proof_; }

  /**
   * @brief Get range proof
   * @return range proof
   */
  ByteData GetRangeProof() const { return range_proof_; }

  /**
   * @brief Get witness hash
   * @return witness hash
   */
  ByteData256 GetWitnessHash() const;

  /**
   * @brief Get unblind data.
   * @param[in] blinding_key    blinding key
   * @return unblind parameter
   */
  UnblindParameter Unblind(const Privkey& blinding_key) const;

  /**
   * @brief Create ConfidentialTxOut object for the destroy amount.
   * @param[in] asset               destroy asset.
   * @param[in] amount              destroy amount.
   * @return ConfidentialTxOut object.
   */
  static ConfidentialTxOut CreateDestroyAmountTxOut(
      const ConfidentialAssetId& asset, const Amount& amount);

  /**
   * @brief Decode range-proof and extract information.
   * @param[in] range_proof ByteData of range-proof value
   * @return struct RangeProofInfo including decoded range-proof information
   */
  static const RangeProofInfo DecodeRangeProofInfo(
      const ByteData& range_proof);

 private:
  ConfidentialAssetId asset_;             //!< confidential asset
  ConfidentialValue confidential_value_;  //!< confidential value.
  ConfidentialNonce nonce_;               //!< nonce
  ByteData surjection_proof_;             //!< surjection proof
  ByteData range_proof_;                  //!< range proof
}